

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineFactoryVk.cpp
# Opt level: O2

GraphicsAdapterInfo *
Diligent::anon_unknown_0::GetPhysicalDeviceGraphicsAdapterInfo
          (GraphicsAdapterInfo *__return_storage_ptr__,VulkanPhysicalDevice *PhysicalDevice)

{
  RAY_TRACING_CAP_FLAGS *pRVar1;
  SHADING_RATE_CAP_FLAGS *pSVar2;
  BIND_FLAGS *pBVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  char cVar8;
  uint32_t uVar9;
  VkBool32 VVar10;
  VkBool32 VVar11;
  SPARSE_RESOURCE_CAP_FLAGS SVar12;
  VkDeviceSize VVar13;
  pointer pVVar14;
  int iVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint64_t uVar19;
  pointer pVVar20;
  ADAPTER_TYPE AVar21;
  ADAPTER_VENDOR AVar22;
  byte bVar23;
  SAMPLE_COUNT SVar24;
  SHADING_RATE SVar25;
  COMMAND_QUEUE_TYPE CVar26;
  SHADING_RATE_CAP_FLAGS SVar27;
  DRAW_COMMAND_CAP_FLAGS DVar28;
  DRAW_COMMAND_CAP_FLAGS DVar29;
  SHADER_TYPE SVar30;
  WAVE_FEATURE WVar31;
  SPARSE_RESOURCE_CAP_FLAGS SVar32;
  size_t i;
  uint uVar35;
  long lVar33;
  SHADING_RATE_COMBINER SVar34;
  uint uVar36;
  VkPhysicalDeviceFragmentShadingRateKHR *SR;
  char (*Args_1) [22];
  pointer Args_1_00;
  ulong uVar37;
  Uint32 i_1;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  CPU_ACCESS_FLAGS CVar41;
  uint32_t type;
  ulong uVar42;
  VkMemoryHeap *pVVar43;
  Uint64 UVar44;
  DeviceFeatures *Src;
  Uint64 UVar45;
  Uint64 UVar46;
  Uint32 *pUVar47;
  bool bVar48;
  BufferProperties BVar49;
  MeshShaderProperties MVar50;
  Uint32 ShadingRateCount;
  uint uStack_94;
  VkFormatFeatureFlags local_90;
  vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
  ShadingRates;
  string msg;
  undefined7 uStack_50;
  DEVICE_FEATURE_STATE DStack_49;
  DEVICE_FEATURE_STATE DStack_48;
  DEVICE_FEATURE_STATE DStack_47;
  DEVICE_FEATURE_STATE DStack_46;
  DEVICE_FEATURE_STATE DStack_45;
  DEVICE_FEATURE_STATE DStack_44;
  DEVICE_FEATURE_STATE DStack_43;
  DEVICE_FEATURE_STATE DStack_42;
  VkStructureType local_38;
  VkFormat local_34;
  
  GraphicsAdapterInfo::GraphicsAdapterInfo(__return_storage_ptr__);
  uVar9 = PhysicalDevice->m_VkVersion;
  for (lVar33 = 0;
      (lVar33 != 0x7f && (cVar8 = (PhysicalDevice->m_Properties).deviceName[lVar33], cVar8 != '\0'))
      ; lVar33 = lVar33 + 1) {
    __return_storage_ptr__->Description[lVar33] = cVar8;
  }
  AVar21 = VkPhysicalDeviceTypeToAdapterType((PhysicalDevice->m_Properties).deviceType);
  __return_storage_ptr__->Type = AVar21;
  AVar22 = VendorIdToAdapterVendor((PhysicalDevice->m_Properties).vendorID);
  __return_storage_ptr__->Vendor = AVar22;
  uVar16 = (PhysicalDevice->m_Properties).deviceID;
  __return_storage_ptr__->VendorId = (PhysicalDevice->m_Properties).vendorID;
  __return_storage_ptr__->DeviceId = uVar16;
  __return_storage_ptr__->NumOutputs = 0;
  VkFeaturesToDeviceFeatures
            ((DeviceFeatures *)&msg,uVar9,&PhysicalDevice->m_Features,&PhysicalDevice->m_Properties,
             &PhysicalDevice->m_ExtFeatures,&PhysicalDevice->m_ExtProperties,
             DEVICE_FEATURE_STATE_OPTIONAL);
  (__return_storage_ptr__->Features).UniformBuffer8BitAccess = msg.field_2._15_1_;
  (__return_storage_ptr__->Features).ShaderResourceStaticArrays = (char)uStack_50;
  (__return_storage_ptr__->Features).ShaderResourceRuntimeArrays = SUB71(uStack_50,1);
  (__return_storage_ptr__->Features).WaveOp = SUB71(uStack_50,2);
  (__return_storage_ptr__->Features).InstanceDataStepRate = SUB71(uStack_50,3);
  (__return_storage_ptr__->Features).NativeFence = SUB71(uStack_50,4);
  (__return_storage_ptr__->Features).TileShaders = SUB71(uStack_50,5);
  (__return_storage_ptr__->Features).TransferQueueTimestampQueries = SUB71(uStack_50,6);
  (__return_storage_ptr__->Features).VariableRateShading = DStack_49;
  (__return_storage_ptr__->Features).SparseResources = DStack_48;
  (__return_storage_ptr__->Features).SubpassFramebufferFetch = DStack_47;
  (__return_storage_ptr__->Features).TextureComponentSwizzle = DStack_46;
  (__return_storage_ptr__->Features).TextureSubresourceViews = DStack_45;
  (__return_storage_ptr__->Features).NativeMultiDraw = DStack_44;
  (__return_storage_ptr__->Features).AsyncShaderCompilation = DStack_43;
  (__return_storage_ptr__->Features).FormattedBuffers = DStack_42;
  (__return_storage_ptr__->Features).DepthClamp = msg.field_2._M_allocated_capacity._0_1_;
  (__return_storage_ptr__->Features).IndependentBlend = msg.field_2._1_1_;
  (__return_storage_ptr__->Features).DualSourceBlend = msg.field_2._2_1_;
  (__return_storage_ptr__->Features).MultiViewport = msg.field_2._3_1_;
  (__return_storage_ptr__->Features).TextureCompressionBC = msg.field_2._4_1_;
  (__return_storage_ptr__->Features).TextureCompressionETC2 = msg.field_2._5_1_;
  (__return_storage_ptr__->Features).VertexPipelineUAVWritesAndAtomics = msg.field_2._6_1_;
  (__return_storage_ptr__->Features).PixelUAVWritesAndAtomics = msg.field_2._7_1_;
  (__return_storage_ptr__->Features).TextureUAVExtendedFormats = (char)msg.field_2._8_7_;
  (__return_storage_ptr__->Features).ShaderFloat16 = (char)((uint7)msg.field_2._8_7_ >> 8);
  (__return_storage_ptr__->Features).ResourceBuffer16BitAccess =
       (char)((uint7)msg.field_2._8_7_ >> 0x10);
  (__return_storage_ptr__->Features).UniformBuffer16BitAccess =
       (char)((uint7)msg.field_2._8_7_ >> 0x18);
  (__return_storage_ptr__->Features).ShaderInputOutput16 = (char)((uint7)msg.field_2._8_7_ >> 0x20);
  (__return_storage_ptr__->Features).ShaderInt8 = (char)((uint7)msg.field_2._8_7_ >> 0x28);
  (__return_storage_ptr__->Features).ResourceBuffer8BitAccess =
       (char)((uint7)msg.field_2._8_7_ >> 0x30);
  (__return_storage_ptr__->Features).UniformBuffer8BitAccess = msg.field_2._15_1_;
  *(pointer *)&__return_storage_ptr__->Features = msg._M_dataplus._M_p;
  (__return_storage_ptr__->Features).RayTracing = (undefined1)msg._M_string_length;
  (__return_storage_ptr__->Features).BindlessResources = msg._M_string_length._1_1_;
  (__return_storage_ptr__->Features).OcclusionQueries = msg._M_string_length._2_1_;
  (__return_storage_ptr__->Features).BinaryOcclusionQueries = msg._M_string_length._3_1_;
  (__return_storage_ptr__->Features).TimestampQueries = msg._M_string_length._4_1_;
  (__return_storage_ptr__->Features).PipelineStatisticsQueries = msg._M_string_length._5_1_;
  (__return_storage_ptr__->Features).DurationQueries = msg._M_string_length._6_1_;
  (__return_storage_ptr__->Features).DepthBiasClamp = msg._M_string_length._7_1_;
  BVar49.StructuredBufferOffsetAlignment =
       (Uint32)(PhysicalDevice->m_Properties).limits.minStorageBufferOffsetAlignment;
  BVar49.ConstantBufferOffsetAlignment =
       (Uint32)(PhysicalDevice->m_Properties).limits.minUniformBufferOffsetAlignment;
  __return_storage_ptr__->Buffer = BVar49;
  (__return_storage_ptr__->Texture).MaxTexture1DDimension =
       (PhysicalDevice->m_Properties).limits.maxImageDimension1D;
  uVar9 = (PhysicalDevice->m_Properties).limits.maxImageDimension2D;
  uVar16 = (PhysicalDevice->m_Properties).limits.maxImageDimension3D;
  uVar17 = (PhysicalDevice->m_Properties).limits.maxImageDimensionCube;
  uVar18 = (PhysicalDevice->m_Properties).limits.maxImageArrayLayers;
  (__return_storage_ptr__->Texture).MaxTexture1DArraySlices = uVar18;
  (__return_storage_ptr__->Texture).MaxTexture2DDimension = uVar9;
  (__return_storage_ptr__->Texture).MaxTexture2DArraySlices = uVar18;
  (__return_storage_ptr__->Texture).MaxTexture3DDimension = uVar16;
  (__return_storage_ptr__->Texture).MaxTextureCubeDimension = uVar17;
  (__return_storage_ptr__->Texture).Texture2DMSSupported = true;
  (__return_storage_ptr__->Texture).Texture2DMSArraySupported = true;
  (__return_storage_ptr__->Texture).TextureViewSupported = true;
  (__return_storage_ptr__->Texture).CubemapArraysSupported =
       (PhysicalDevice->m_Features).imageCubeArray != 0;
  (__return_storage_ptr__->Texture).TextureView2DOn3DSupported =
       (Bool)((PhysicalDevice->m_ExtFeatures).HasPortabilitySubset ^ 1U |
             (PhysicalDevice->m_ExtFeatures).PortabilitySubset.imageView2DOn3DImage == 1);
  (__return_storage_ptr__->Sampler).BorderSamplingModeSupported = true;
  uVar35 = (uint)(PhysicalDevice->m_Properties).limits.maxSamplerAnisotropy;
  Args_1_00 = (pointer)(ulong)uVar35;
  (__return_storage_ptr__->Sampler).MaxAnisotropy = (Uint8)uVar35;
  (__return_storage_ptr__->Sampler).LODBiasSupported = true;
  if ((__return_storage_ptr__->Features).RayTracing != DEVICE_FEATURE_STATE_DISABLED) {
    uVar9 = (PhysicalDevice->m_ExtProperties).RayTracingPipeline.shaderGroupHandleSize;
    uVar16 = (PhysicalDevice->m_ExtProperties).RayTracingPipeline.maxShaderGroupStride;
    uVar17 = (PhysicalDevice->m_ExtProperties).RayTracingPipeline.shaderGroupBaseAlignment;
    (__return_storage_ptr__->RayTracing).MaxRecursionDepth =
         (PhysicalDevice->m_ExtProperties).RayTracingPipeline.maxRayRecursionDepth;
    (__return_storage_ptr__->RayTracing).ShaderGroupHandleSize = uVar9;
    (__return_storage_ptr__->RayTracing).MaxShaderRecordStride = uVar16;
    (__return_storage_ptr__->RayTracing).ShaderGroupBaseAlignment = uVar17;
    (__return_storage_ptr__->RayTracing).MaxRayGenThreads =
         (PhysicalDevice->m_ExtProperties).RayTracingPipeline.maxRayDispatchInvocationCount;
    uVar19 = (PhysicalDevice->m_ExtProperties).AccelStruct.maxPrimitiveCount;
    (__return_storage_ptr__->RayTracing).MaxInstancesPerTLAS =
         (int)(PhysicalDevice->m_ExtProperties).AccelStruct.maxInstanceCount;
    (__return_storage_ptr__->RayTracing).MaxPrimitivesPerBLAS = (int)uVar19;
    (__return_storage_ptr__->RayTracing).MaxGeometriesPerBLAS =
         (Uint32)(PhysicalDevice->m_ExtProperties).AccelStruct.maxGeometryCount;
    (__return_storage_ptr__->RayTracing).VertexBufferAlignment = 1;
    (__return_storage_ptr__->RayTracing).IndexBufferAlignment = 1;
    (__return_storage_ptr__->RayTracing).TransformBufferAlignment = 0x10;
    (__return_storage_ptr__->RayTracing).BoxBufferAlignment = 8;
    (__return_storage_ptr__->RayTracing).ScratchBufferAlignment =
         (PhysicalDevice->m_ExtProperties).AccelStruct.
         minAccelerationStructureScratchOffsetAlignment;
    (__return_storage_ptr__->RayTracing).InstanceBufferAlignment = 0x10;
    if ((PhysicalDevice->m_ExtFeatures).RayTracingPipeline.rayTracingPipeline != 0) {
      pRVar1 = &(__return_storage_ptr__->RayTracing).CapFlags;
      *pRVar1 = *pRVar1 | RAY_TRACING_CAP_FLAG_STANDALONE_SHADERS;
    }
    if ((PhysicalDevice->m_ExtFeatures).RayQuery.rayQuery != 0) {
      pRVar1 = &(__return_storage_ptr__->RayTracing).CapFlags;
      *pRVar1 = *pRVar1 | RAY_TRACING_CAP_FLAG_INLINE_RAY_TRACING;
    }
    if ((PhysicalDevice->m_ExtFeatures).RayTracingPipeline.rayTracingPipelineTraceRaysIndirect != 0)
    {
      pRVar1 = &(__return_storage_ptr__->RayTracing).CapFlags;
      *pRVar1 = *pRVar1 | RAY_TRACING_CAP_FLAG_INDIRECT_RAY_TRACING;
    }
  }
  if ((__return_storage_ptr__->Features).WaveOp != DEVICE_FEATURE_STATE_DISABLED) {
    bVar48 = (PhysicalDevice->m_Features).geometryShader != 0;
    iVar15 = 0x37;
    if ((PhysicalDevice->m_Features).tessellationShader == 0) {
      iVar15 = 0x31;
    }
    uVar36 = iVar15 + (uint)bVar48 * 8;
    Args_1_00 = (pointer)(ulong)uVar36;
    uVar35 = iVar15 + 0xc0 + (uint)bVar48 * 8;
    if ((PhysicalDevice->m_ExtFeatures).MeshShader.taskShader == 0) {
      uVar35 = uVar36;
    }
    if ((PhysicalDevice->m_ExtFeatures).MeshShader.meshShader == 0) {
      uVar35 = uVar36;
    }
    uVar36 = uVar35 | 0x3f00;
    if ((PhysicalDevice->m_ExtFeatures).RayTracingPipeline.rayTracingPipeline == 0) {
      uVar36 = uVar35;
    }
    uVar35 = (PhysicalDevice->m_ExtProperties).Subgroup.supportedStages;
    uVar9 = (PhysicalDevice->m_ExtProperties).Subgroup.subgroupSize;
    (__return_storage_ptr__->WaveOp).MinSize = uVar9;
    (__return_storage_ptr__->WaveOp).MaxSize = uVar9;
    SVar30 = VkShaderStageFlagsToShaderTypes(uVar36 & uVar35);
    (__return_storage_ptr__->WaveOp).SupportedStages = SVar30;
    WVar31 = VkSubgroupFeatureFlagsToWaveFeatures
                       ((PhysicalDevice->m_ExtProperties).Subgroup.supportedOperations);
    (__return_storage_ptr__->WaveOp).Features = WVar31;
  }
  if ((__return_storage_ptr__->Features).MeshShaders != DEVICE_FEATURE_STATE_DISABLED) {
    uVar4 = (PhysicalDevice->m_ExtProperties).MeshShader.maxMeshWorkGroupTotalCount;
    uVar5 = (PhysicalDevice->m_ExtProperties).MeshShader.maxMeshWorkGroupCount[0];
    uVar6 = (PhysicalDevice->m_ExtProperties).MeshShader.maxMeshWorkGroupCount[1];
    uVar7 = (PhysicalDevice->m_ExtProperties).MeshShader.maxMeshWorkGroupCount[2];
    MVar50.MaxThreadGroupCountZ = uVar7;
    MVar50.MaxThreadGroupCountY = uVar6;
    MVar50.MaxThreadGroupCountX = uVar5;
    MVar50.MaxThreadGroupTotalCount = uVar4;
    __return_storage_ptr__->MeshShader = MVar50;
  }
  (__return_storage_ptr__->ComputeShader).SharedMemorySize =
       (PhysicalDevice->m_Properties).limits.maxComputeSharedMemorySize;
  uVar9 = (PhysicalDevice->m_Properties).limits.maxComputeWorkGroupSize[0];
  uVar16 = (PhysicalDevice->m_Properties).limits.maxComputeWorkGroupSize[1];
  uVar17 = (PhysicalDevice->m_Properties).limits.maxComputeWorkGroupSize[2];
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupInvocations =
       (PhysicalDevice->m_Properties).limits.maxComputeWorkGroupInvocations;
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupSizeX = uVar9;
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupSizeY = uVar16;
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupSizeZ = uVar17;
  uVar9 = (PhysicalDevice->m_Properties).limits.maxComputeWorkGroupCount[1];
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupCountX =
       (PhysicalDevice->m_Properties).limits.maxComputeWorkGroupCount[0];
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupCountY = uVar9;
  (__return_storage_ptr__->ComputeShader).MaxThreadGroupCountZ =
       (PhysicalDevice->m_Properties).limits.maxComputeWorkGroupCount[2];
  if ((__return_storage_ptr__->Features).VariableRateShading != DEVICE_FEATURE_STATE_DISABLED) {
    VVar10 = (PhysicalDevice->m_ExtFeatures).ShadingRate.pipelineFragmentShadingRate;
    uVar35 = (PhysicalDevice->m_ExtFeatures).ShadingRate.primitiveFragmentShadingRate;
    Args_1_00 = (pointer)(ulong)uVar35;
    VVar11 = (PhysicalDevice->m_ExtFeatures).ShadingRate.attachmentFragmentShadingRate;
    if ((VVar10 == 0 && uVar35 == 0) && VVar11 == 0) {
      if ((PhysicalDevice->m_ExtFeatures).FragmentDensityMap.fragmentDensityMap != 0) {
        (__return_storage_ptr__->ShadingRate).CapFlags =
             SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET|
             SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS|
             SHADING_RATE_CAP_FLAG_TEXTURE_BASED;
        (__return_storage_ptr__->ShadingRate).Combiners =
             SHADING_RATE_COMBINER_OVERRIDE|SHADING_RATE_COMBINER_PASSTHROUGH;
        (__return_storage_ptr__->ShadingRate).Format = SHADING_RATE_FORMAT_UNORM8;
        if ((PhysicalDevice->m_ExtFeatures).FragmentDensityMap.fragmentDensityMapDynamic == 0) {
          if ((PhysicalDevice->m_ExtFeatures).FragmentDensityMap2.fragmentDensityMapDeferred == 0) {
            (__return_storage_ptr__->ShadingRate).ShadingRateTextureAccess =
                 SHADING_RATE_TEXTURE_ACCESS_ON_SET_RTV;
          }
          else {
            (__return_storage_ptr__->ShadingRate).ShadingRateTextureAccess =
                 SHADING_RATE_TEXTURE_ACCESS_ON_SUBMIT;
          }
        }
        else {
          (__return_storage_ptr__->ShadingRate).ShadingRateTextureAccess =
               SHADING_RATE_TEXTURE_ACCESS_ON_GPU;
        }
        if ((PhysicalDevice->m_ExtProperties).FragmentDensityMap.fragmentDensityInvocations == 0) {
          SVar27 = SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET|
                   SHADING_RATE_CAP_FLAG_NON_SUBSAMPLED_RENDER_TARGET|
                   SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS|
                   SHADING_RATE_CAP_FLAG_TEXTURE_BASED;
        }
        else {
          (__return_storage_ptr__->ShadingRate).CapFlags =
               SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET|
               SHADING_RATE_CAP_FLAG_ADDITIONAL_INVOCATIONS|
               SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS|
               SHADING_RATE_CAP_FLAG_TEXTURE_BASED;
          SVar27 = SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET|
                   SHADING_RATE_CAP_FLAG_NON_SUBSAMPLED_RENDER_TARGET|
                   SHADING_RATE_CAP_FLAG_ADDITIONAL_INVOCATIONS|
                   SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS|
                   SHADING_RATE_CAP_FLAG_TEXTURE_BASED;
        }
        if ((PhysicalDevice->m_ExtFeatures).FragmentDensityMap.fragmentDensityMapNonSubsampledImages
            != 0) {
          (__return_storage_ptr__->ShadingRate).CapFlags = SVar27;
        }
        (__return_storage_ptr__->ShadingRate).MaxSabsampledArraySlices =
             (PhysicalDevice->m_ExtProperties).FragmentDensityMap2.maxSubsampledArrayLayers;
        uVar9 = (PhysicalDevice->m_ExtProperties).FragmentDensityMap.minFragmentDensityTexelSize.
                height;
        uVar16 = (PhysicalDevice->m_ExtProperties).FragmentDensityMap.maxFragmentDensityTexelSize.
                 width;
        uVar17 = (PhysicalDevice->m_ExtProperties).FragmentDensityMap.maxFragmentDensityTexelSize.
                 height;
        (__return_storage_ptr__->ShadingRate).MinTileSize[0] =
             (PhysicalDevice->m_ExtProperties).FragmentDensityMap.minFragmentDensityTexelSize.width;
        (__return_storage_ptr__->ShadingRate).MinTileSize[1] = uVar9;
        (__return_storage_ptr__->ShadingRate).MaxTileSize[0] = uVar16;
        (__return_storage_ptr__->ShadingRate).MaxTileSize[1] = uVar17;
        (__return_storage_ptr__->ShadingRate).NumShadingRates = '\x01';
        (__return_storage_ptr__->ShadingRate).ShadingRates[0].Rate = SHADING_RATE_1X1;
        (__return_storage_ptr__->ShadingRate).ShadingRates[0].SampleBits = SAMPLE_COUNT_ALL;
      }
    }
    else {
      if (VVar10 != 0) {
        pSVar2 = &(__return_storage_ptr__->ShadingRate).CapFlags;
        *(undefined1 *)pSVar2 = (char)*pSVar2 | SHADING_RATE_CAP_FLAG_PER_DRAW;
      }
      if (uVar35 != 0) {
        pSVar2 = &(__return_storage_ptr__->ShadingRate).CapFlags;
        *(undefined1 *)pSVar2 = (char)*pSVar2 | SHADING_RATE_CAP_FLAG_PER_PRIMITIVE;
      }
      if (VVar11 != 0) {
        pSVar2 = &(__return_storage_ptr__->ShadingRate).CapFlags;
        *(undefined1 *)pSVar2 = (char)*pSVar2 | SHADING_RATE_CAP_FLAG_TEXTURE_BASED;
      }
      if ((PhysicalDevice->m_ExtProperties).ShadingRate.fragmentShadingRateWithSampleMask != 0) {
        pSVar2 = &(__return_storage_ptr__->ShadingRate).CapFlags;
        *(undefined1 *)pSVar2 = (char)*pSVar2 | SHADING_RATE_CAP_FLAG_SAMPLE_MASK;
      }
      if ((PhysicalDevice->m_ExtProperties).ShadingRate.fragmentShadingRateWithShaderSampleMask != 0
         ) {
        pSVar2 = &(__return_storage_ptr__->ShadingRate).CapFlags;
        *(undefined1 *)pSVar2 = (char)*pSVar2 | SHADING_RATE_CAP_FLAG_SHADER_SAMPLE_MASK;
      }
      if ((PhysicalDevice->m_ExtProperties).ShadingRate.
          fragmentShadingRateWithShaderDepthStencilWrites != 0) {
        pSVar2 = &(__return_storage_ptr__->ShadingRate).CapFlags;
        *(undefined1 *)pSVar2 = (char)*pSVar2 | SHADING_RATE_CAP_FLAG_SHADER_DEPTH_STENCIL_WRITE;
      }
      if ((PhysicalDevice->m_ExtProperties).ShadingRate.
          primitiveFragmentShadingRateWithMultipleViewports != 0) {
        pSVar2 = &(__return_storage_ptr__->ShadingRate).CapFlags;
        *(undefined1 *)pSVar2 =
             (char)*pSVar2 | SHADING_RATE_CAP_FLAG_PER_PRIMITIVE_WITH_MULTIPLE_VIEWPORTS;
      }
      uVar35._0_2_ = (__return_storage_ptr__->ShadingRate).CapFlags;
      uVar35._2_1_ = (__return_storage_ptr__->ShadingRate).Combiners;
      uVar35._3_1_ = (__return_storage_ptr__->ShadingRate).Format;
      uVar36 = uVar35 | 0x100;
      if ((PhysicalDevice->m_ExtProperties).ShadingRate.layeredShadingRateAttachments == 0) {
        uVar36 = uVar35;
      }
      uVar35 = (uVar36 & 4) << 9 | uVar36 | 0x200;
      (__return_storage_ptr__->ShadingRate).CapFlags = (SHADING_RATE_CAP_FLAGS)uVar35;
      (__return_storage_ptr__->ShadingRate).Combiners =
           SHADING_RATE_COMBINER_OVERRIDE|SHADING_RATE_COMBINER_PASSTHROUGH;
      if ((PhysicalDevice->m_ExtProperties).ShadingRate.fragmentShadingRateNonTrivialCombinerOps !=
          0) {
        SVar34 = ((PhysicalDevice->m_ExtProperties).ShadingRate.
                  fragmentShadingRateStrictMultiplyCombiner != 0) * '\x10' +
                 (SHADING_RATE_COMBINER_SUM|SHADING_RATE_COMBINER_MAX|SHADING_RATE_COMBINER_MIN|
                  SHADING_RATE_COMBINER_OVERRIDE|SHADING_RATE_COMBINER_PASSTHROUGH);
        uVar35 = CONCAT31((int3)(uVar35 >> 8),SVar34);
        (__return_storage_ptr__->ShadingRate).Combiners = SVar34;
      }
      Args_1 = (char (*) [22])(ulong)uVar35;
      if (VVar11 != 0) {
        (__return_storage_ptr__->ShadingRate).Format = SHADING_RATE_FORMAT_PALETTE;
        uVar9 = (PhysicalDevice->m_ExtProperties).ShadingRate.
                minFragmentShadingRateAttachmentTexelSize.height;
        uVar16 = (PhysicalDevice->m_ExtProperties).ShadingRate.
                 maxFragmentShadingRateAttachmentTexelSize.width;
        uVar17 = (PhysicalDevice->m_ExtProperties).ShadingRate.
                 maxFragmentShadingRateAttachmentTexelSize.height;
        (__return_storage_ptr__->ShadingRate).MinTileSize[0] =
             (PhysicalDevice->m_ExtProperties).ShadingRate.minFragmentShadingRateAttachmentTexelSize
             .width;
        (__return_storage_ptr__->ShadingRate).MinTileSize[1] = uVar9;
        (__return_storage_ptr__->ShadingRate).MaxTileSize[0] = uVar16;
        (__return_storage_ptr__->ShadingRate).MaxTileSize[1] = uVar17;
      }
      ShadingRates.
      super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      _ShadingRateCount = _ShadingRateCount & 0xffffffff00000000;
      ShadingRates.
      super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ShadingRates.
      super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (*vkGetPhysicalDeviceFragmentShadingRatesKHR)
                (PhysicalDevice->m_VkDevice,&ShadingRateCount,
                 (VkPhysicalDeviceFragmentShadingRateKHR *)0x0);
      if (ShadingRateCount < 3) {
        FormatString<char[26],char[22]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"ShadingRateCount >= 3",Args_1);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"GetPhysicalDeviceGraphicsAdapterInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/EngineFactoryVk.cpp"
                   ,0x15d);
        std::__cxx11::string::~string((string *)&msg);
      }
      std::
      vector<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
      ::resize(&ShadingRates,(ulong)ShadingRateCount);
      for (Args_1_00 = ShadingRates.
                       super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          Args_1_00 !=
          ShadingRates.
          super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
          ._M_impl.super__Vector_impl_data._M_finish; Args_1_00 = Args_1_00 + 1) {
        Args_1_00->sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_KHR;
      }
      (*vkGetPhysicalDeviceFragmentShadingRatesKHR)
                (PhysicalDevice->m_VkDevice,(uint32_t *)&ShadingRateCount,
                 ShadingRates.
                 super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      msg._M_dataplus._M_p =
           (pointer)((long)ShadingRates.
                           super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)ShadingRates.
                           super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5);
      _ShadingRateCount = 9;
      Src = (DeviceFeatures *)&msg;
      if ((pointer)0x9 < msg._M_dataplus._M_p) {
        Src = (DeviceFeatures *)&ShadingRateCount;
      }
      bVar23 = StaticCast<unsigned_char,unsigned_long>((unsigned_long *)Src);
      (__return_storage_ptr__->ShadingRate).NumShadingRates = bVar23;
      lVar33 = 0x10;
      for (uVar37 = 0;
          pVVar20 = ShadingRates.
                    super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                    ._M_impl.super__Vector_impl_data._M_start, uVar37 < bVar23; uVar37 = uVar37 + 1)
      {
        if (((*(int *)(&(ShadingRates.
                         super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                         ._M_impl.super__Vector_impl_data._M_start)->field_0x4 + lVar33) != 1) ||
            (*(int *)((long)&(ShadingRates.
                              super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                              ._M_impl.super__Vector_impl_data._M_start)->pNext + lVar33) != 1)) &&
           ((PhysicalDevice->m_ExtProperties).ShadingRate.maxFragmentShadingRateRasterizationSamples
            * 2 - 1 < *(uint *)((long)&(ShadingRates.
                                        super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->sType + lVar33))
           ) {
          FormatString<char[26],char[201]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])
                     "(Src.fragmentSize.width == 1 && Src.fragmentSize.height == 1) || (Uint32{Src.sampleCounts} <= ((static_cast<Uint32>(vkDeviceExtProps.ShadingRate.maxFragmentShadingRateRasterizationSamples) << 1) - 1))"
                     ,(char (*) [201])Args_1_00);
          Args_1_00 = (pointer)0x172;
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"GetPhysicalDeviceGraphicsAdapterInfo",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/EngineFactoryVk.cpp"
                     ,0x172);
          std::__cxx11::string::~string((string *)&msg);
        }
        SVar24 = VkSampleCountFlagsToSampleCount(*(uint *)((long)&pVVar20->sType + lVar33) & 0x7f);
        (__return_storage_ptr__->ShadingRate).ShadingRates[uVar37].SampleBits = SVar24;
        SVar25 = VkFragmentSizeToShadingRate((VkExtent2D *)(&pVVar20->field_0x4 + lVar33));
        (__return_storage_ptr__->ShadingRate).ShadingRates[uVar37].Rate = SVar25;
        bVar23 = (__return_storage_ptr__->ShadingRate).NumShadingRates;
        lVar33 = lVar33 + 0x20;
      }
      std::
      _Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
      ::~_Vector_base(&ShadingRates.
                       super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
                     );
    }
    if (((__return_storage_ptr__->ShadingRate).CapFlags & SHADING_RATE_CAP_FLAG_TEXTURE_BASED) !=
        SHADING_RATE_CAP_FLAG_NONE) {
      bVar48 = (__return_storage_ptr__->ShadingRate).Format == SHADING_RATE_FORMAT_UNORM8;
      local_34 = (uint)bVar48 * 3 + VK_FORMAT_R8_UINT;
      local_38 = (uint)bVar48 * 0x100 + 0x100;
      Args_1_00 = (pointer)&local_34;
      ShadingRates.
      super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&local_38;
      local_90 = 0;
      _ShadingRateCount = 0;
      ShadingRates.
      super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)PhysicalDevice;
      ShadingRates.
      super__Vector_base<VkPhysicalDeviceFragmentShadingRateKHR,_std::allocator<VkPhysicalDeviceFragmentShadingRateKHR>_>
      ._M_impl.super__Vector_impl_data._M_finish = Args_1_00;
      (*vkGetPhysicalDeviceFormatProperties)
                (PhysicalDevice->m_VkDevice,local_34,(VkFormatProperties *)&ShadingRateCount);
      if ((_ShadingRateCount & 0x4100000000000000) == 0) {
        FormatString<char[26],char[145]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "vkFmtProps.optimalTilingFeatures & (VK_FORMAT_FEATURE_FRAGMENT_SHADING_RATE_ATTACHMENT_BIT_KHR | VK_FORMAT_FEATURE_FRAGMENT_DENSITY_MAP_BIT_EXT)"
                   ,(char (*) [145])Args_1_00);
        Args_1_00 = (pointer)0x1b5;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"GetPhysicalDeviceGraphicsAdapterInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/EngineFactoryVk.cpp"
                   ,0x1b5);
        std::__cxx11::string::~string((string *)&msg);
      }
      (__return_storage_ptr__->ShadingRate).BindFlags = BIND_FLAG_LAST;
      if ((uStack_94 & 1) != 0) {
        bVar48 = GetPhysicalDeviceGraphicsAdapterInfo::anon_class_24_3_af8bfc46::operator()
                           ((anon_class_24_3_af8bfc46 *)&ShadingRates,4);
        if (bVar48) {
          pBVar3 = &(__return_storage_ptr__->ShadingRate).BindFlags;
          *(undefined1 *)pBVar3 = (char)*pBVar3 | BIND_SHADER_RESOURCE;
        }
      }
      if ((_ShadingRateCount & 0x200000000) != 0) {
        bVar48 = GetPhysicalDeviceGraphicsAdapterInfo::anon_class_24_3_af8bfc46::operator()
                           ((anon_class_24_3_af8bfc46 *)&ShadingRates,8);
        if (bVar48) {
          pBVar3 = &(__return_storage_ptr__->ShadingRate).BindFlags;
          *(undefined1 *)pBVar3 = (char)*pBVar3 | BIND_UNORDERED_ACCESS;
        }
      }
      if ((_ShadingRateCount & 0x8000000000) != 0) {
        bVar48 = GetPhysicalDeviceGraphicsAdapterInfo::anon_class_24_3_af8bfc46::operator()
                           ((anon_class_24_3_af8bfc46 *)&ShadingRates,0x10);
        if (bVar48) {
          pBVar3 = &(__return_storage_ptr__->ShadingRate).BindFlags;
          *(undefined1 *)pBVar3 = (char)*pBVar3 | BIND_RENDER_TARGET;
        }
      }
    }
  }
  uVar9 = (PhysicalDevice->m_Properties).limits.maxDrawIndirectCount;
  (__return_storage_ptr__->DrawCommand).MaxIndexValue =
       (PhysicalDevice->m_Properties).limits.maxDrawIndexedIndexValue;
  (__return_storage_ptr__->DrawCommand).MaxDrawIndirectCount = uVar9;
  (__return_storage_ptr__->DrawCommand).CapFlags =
       DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT|DRAW_COMMAND_CAP_FLAG_BASE_VERTEX;
  if ((PhysicalDevice->m_Features).multiDrawIndirect == 0) {
    DVar28 = DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT|DRAW_COMMAND_CAP_FLAG_BASE_VERTEX;
    DVar29 = DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT|DRAW_COMMAND_CAP_FLAG_BASE_VERTEX;
    if ((PhysicalDevice->m_ExtFeatures).DrawIndirectCount != true) goto LAB_001ee80c;
  }
  (__return_storage_ptr__->DrawCommand).CapFlags =
       DRAW_COMMAND_CAP_FLAG_NATIVE_MULTI_DRAW_INDIRECT|DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT|
       DRAW_COMMAND_CAP_FLAG_BASE_VERTEX;
  DVar28 = DRAW_COMMAND_CAP_FLAG_NATIVE_MULTI_DRAW_INDIRECT|DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT|
           DRAW_COMMAND_CAP_FLAG_BASE_VERTEX;
  DVar29 = DRAW_COMMAND_CAP_FLAG_NATIVE_MULTI_DRAW_INDIRECT|DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT|
           DRAW_COMMAND_CAP_FLAG_BASE_VERTEX;
LAB_001ee80c:
  if ((PhysicalDevice->m_Features).drawIndirectFirstInstance != 0) {
    DVar29 = DVar28 | DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_FIRST_INSTANCE;
    (__return_storage_ptr__->DrawCommand).CapFlags = DVar29;
  }
  if ((PhysicalDevice->m_ExtFeatures).DrawIndirectCount == true) {
    (__return_storage_ptr__->DrawCommand).CapFlags =
         DVar29 | DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER;
  }
  if ((__return_storage_ptr__->Features).SparseResources != DEVICE_FEATURE_STATE_DISABLED) {
    if (((PhysicalDevice->m_Features).sparseBinding == 0) ||
       ((PhysicalDevice->m_Features).sparseResidencyImage2D == 0 &&
        (PhysicalDevice->m_Features).sparseResidencyBuffer == 0)) {
      FormatString<char[26],char[100]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "vkFeatures.sparseBinding && (vkFeatures.sparseResidencyBuffer || vkFeatures.sparseResidencyImage2D)"
                 ,(char (*) [100])Args_1_00);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetPhysicalDeviceGraphicsAdapterInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/EngineFactoryVk.cpp"
                 ,0x1d6);
      std::__cxx11::string::~string((string *)&msg);
    }
    VVar13 = (PhysicalDevice->m_Properties).limits.sparseAddressSpaceSize;
    (__return_storage_ptr__->SparseResources).AddressSpaceSize = VVar13;
    (__return_storage_ptr__->SparseResources).ResourceSpaceSize = VVar13;
    (__return_storage_ptr__->SparseResources).StandardBlockSize = 0x10000;
    (__return_storage_ptr__->SparseResources).BufferBindFlags =
         BIND_RAY_TRACING|BIND_INDIRECT_DRAW_ARGS|BIND_UNORDERED_ACCESS|BIND_SHADER_RESOURCE|
         BIND_UNIFORM_BUFFER|BIND_INDEX_BUFFER|BIND_VERTEX_BUFFER;
    SVar12 = (__return_storage_ptr__->SparseResources).CapFlags;
    SVar32 = SVar12 | (SPARSE_RESOURCE_CAP_FLAG_MIXED_RESOURCE_TYPE_SUPPORT|
                      SPARSE_RESOURCE_CAP_FLAG_NON_RESIDENT_SAFE);
    (__return_storage_ptr__->SparseResources).CapFlags = SVar32;
    if ((PhysicalDevice->m_Properties).sparseProperties.residencyStandard2DBlockShape != 0) {
      SVar32 = SVar12 | (SPARSE_RESOURCE_CAP_FLAG_MIXED_RESOURCE_TYPE_SUPPORT|
                         SPARSE_RESOURCE_CAP_FLAG_NON_RESIDENT_SAFE|
                        SPARSE_RESOURCE_CAP_FLAG_STANDARD_2D_TILE_SHAPE);
      (__return_storage_ptr__->SparseResources).CapFlags = SVar32;
    }
    if ((PhysicalDevice->m_Properties).sparseProperties.residencyStandard2DMultisampleBlockShape !=
        0) {
      SVar32 = SVar32 | SPARSE_RESOURCE_CAP_FLAG_STANDARD_2DMS_TILE_SHAPE;
      (__return_storage_ptr__->SparseResources).CapFlags = SVar32;
    }
    if ((PhysicalDevice->m_Properties).sparseProperties.residencyStandard3DBlockShape != 0) {
      SVar32 = SVar32 | SPARSE_RESOURCE_CAP_FLAG_STANDARD_3D_TILE_SHAPE;
      (__return_storage_ptr__->SparseResources).CapFlags = SVar32;
    }
    if ((PhysicalDevice->m_Properties).sparseProperties.residencyAlignedMipSize != 0) {
      SVar32 = SVar32 | SPARSE_RESOURCE_CAP_FLAG_ALIGNED_MIP_SIZE;
      (__return_storage_ptr__->SparseResources).CapFlags = SVar32;
    }
    if ((PhysicalDevice->m_Properties).sparseProperties.residencyNonResidentStrict != 0) {
      SVar32 = SVar32 | SPARSE_RESOURCE_CAP_FLAG_NON_RESIDENT_STRICT;
      (__return_storage_ptr__->SparseResources).CapFlags = SVar32;
    }
    if ((PhysicalDevice->m_Features).shaderResourceResidency != 0) {
      SVar32 = SVar32 | SPARSE_RESOURCE_CAP_FLAG_SHADER_RESOURCE_RESIDENCY;
      (__return_storage_ptr__->SparseResources).CapFlags = SVar32;
    }
    if ((PhysicalDevice->m_Features).sparseResidencyBuffer != 0) {
      SVar32 = SVar32 | SPARSE_RESOURCE_CAP_FLAG_BUFFER;
      (__return_storage_ptr__->SparseResources).CapFlags = SVar32;
    }
    if ((PhysicalDevice->m_Features).sparseResidencyImage2D != 0) {
      SVar32 = SVar32 | (SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D_ARRAY_MIP_TAIL|
                        SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D);
      (__return_storage_ptr__->SparseResources).CapFlags = SVar32;
    }
    if ((PhysicalDevice->m_Features).sparseResidencyImage3D != 0) {
      SVar32 = SVar32 | SPARSE_RESOURCE_CAP_FLAG_TEXTURE_3D;
      (__return_storage_ptr__->SparseResources).CapFlags = SVar32;
    }
    if ((PhysicalDevice->m_Features).sparseResidency2Samples != 0) {
      SVar32 = SVar32 | SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2_SAMPLES;
      (__return_storage_ptr__->SparseResources).CapFlags = SVar32;
    }
    if ((PhysicalDevice->m_Features).sparseResidency4Samples != 0) {
      SVar32 = SVar32 | SPARSE_RESOURCE_CAP_FLAG_TEXTURE_4_SAMPLES;
      (__return_storage_ptr__->SparseResources).CapFlags = SVar32;
    }
    if ((PhysicalDevice->m_Features).sparseResidency8Samples != 0) {
      SVar32 = SVar32 | SPARSE_RESOURCE_CAP_FLAG_TEXTURE_8_SAMPLES;
      (__return_storage_ptr__->SparseResources).CapFlags = SVar32;
    }
    if ((PhysicalDevice->m_Features).sparseResidency16Samples != 0) {
      SVar32 = SVar32 | SPARSE_RESOURCE_CAP_FLAG_TEXTURE_16_SAMPLES;
      (__return_storage_ptr__->SparseResources).CapFlags = SVar32;
    }
    if ((PhysicalDevice->m_Features).sparseResidencyAliased != 0) {
      (__return_storage_ptr__->SparseResources).CapFlags = SVar32 | SPARSE_RESOURCE_CAP_FLAG_ALIASED
      ;
    }
  }
  (__return_storage_ptr__->Memory).LocalMemory = 0;
  (__return_storage_ptr__->Memory).HostVisibleMemory = 0;
  (__return_storage_ptr__->Memory).UnifiedMemory = 0;
  (__return_storage_ptr__->Memory).MaxMemoryAllocation =
       (PhysicalDevice->m_ExtProperties).Maintenance3.maxMemoryAllocationSize;
  uVar35 = (PhysicalDevice->m_MemoryProperties).memoryTypeCount;
  CVar41 = (__return_storage_ptr__->Memory).UnifiedMemoryCPUAccess;
  uVar37 = 0;
  uVar39 = 0;
  uVar40 = 0;
  for (uVar42 = 0; uVar35 != uVar42; uVar42 = uVar42 + 1) {
    uVar36 = (PhysicalDevice->m_MemoryProperties).memoryTypes[uVar42].propertyFlags;
    if ((uVar36 & 0x10) == 0) {
      if ((~uVar36 & 3) == 0) {
        uVar40 = uVar40 | 1L << ((ulong)(byte)(PhysicalDevice->m_MemoryProperties).memoryTypes
                                              [uVar42].heapIndex & 0x3f);
        CVar41 = CVar41 | (byte)uVar36 >> 3 & CPU_ACCESS_READ |
                          (byte)uVar36 >> 1 & CPU_ACCESS_FLAG_LAST;
        if ((uVar36 & 0xc) != 0) {
          (__return_storage_ptr__->Memory).UnifiedMemoryCPUAccess = CVar41;
        }
      }
      else if ((uVar36 & 1) == 0) {
        if ((uVar36 & 2) != 0) {
          uVar37 = uVar37 | 1L << ((ulong)(byte)(PhysicalDevice->m_MemoryProperties).memoryTypes
                                                [uVar42].heapIndex & 0x3f);
        }
      }
      else {
        uVar39 = uVar39 | 1L << ((ulong)(byte)(PhysicalDevice->m_MemoryProperties).memoryTypes
                                              [uVar42].heapIndex & 0x3f);
      }
    }
    else {
      (__return_storage_ptr__->Memory).MemorylessTextureBindFlags =
           BIND_INPUT_ATTACHMENT|BIND_DEPTH_STENCIL|BIND_RENDER_TARGET;
    }
  }
  uVar35 = (PhysicalDevice->m_MemoryProperties).memoryHeapCount;
  pVVar43 = (PhysicalDevice->m_MemoryProperties).memoryHeaps;
  UVar46 = 0;
  UVar44 = 0;
  UVar45 = 0;
  for (uVar42 = 0; uVar35 != uVar42; uVar42 = uVar42 + 1) {
    uVar38 = 1L << ((byte)uVar42 & 0x3f);
    if ((uVar40 >> (uVar42 & 0x3f) & 1) == 0) {
      if ((uVar38 & uVar39) == 0) {
        if ((uVar38 & uVar37) != 0) {
          UVar46 = UVar46 + pVVar43->size;
          (__return_storage_ptr__->Memory).HostVisibleMemory = UVar46;
        }
      }
      else {
        UVar44 = UVar44 + pVVar43->size;
        (__return_storage_ptr__->Memory).LocalMemory = UVar44;
      }
    }
    else {
      UVar45 = UVar45 + pVVar43->size;
      (__return_storage_ptr__->Memory).UnifiedMemory = UVar45;
    }
    pVVar43 = pVVar43 + 1;
  }
  uVar39 = ((long)(PhysicalDevice->m_QueueFamilyProperties).
                  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(PhysicalDevice->m_QueueFamilyProperties).
                 super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  uVar37 = 0x10;
  if ((uint)uVar39 < 0x10) {
    uVar37 = uVar39;
  }
  uVar39 = uVar37 & 0xffffffff;
  __return_storage_ptr__->NumQueues = (Uint32)uVar37;
  pUVar47 = __return_storage_ptr__->Queues[0].TextureCopyGranularity + 2;
  lVar33 = 0x14;
  for (uVar37 = 0; uVar37 < uVar39; uVar37 = uVar37 + 1) {
    pVVar14 = (PhysicalDevice->m_QueueFamilyProperties).
              super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
              _M_impl.super__Vector_impl_data._M_start;
    CVar26 = VkQueueFlagsToCmdQueueType(*(VkQueueFlags *)((long)pVVar14 + lVar33 + -0x14));
    ((CommandQueueInfo *)(pUVar47 + -4))->QueueType = CVar26;
    pUVar47[-3] = *(Uint32 *)((long)pVVar14 + lVar33 + -0x10);
    pUVar47[-2] = *(Uint32 *)((long)pVVar14 + lVar33 + -8);
    pUVar47[-1] = *(Uint32 *)((long)pVVar14 + lVar33 + -4);
    *pUVar47 = *(Uint32 *)((long)&pVVar14->queueFlags + lVar33);
    uVar39 = (ulong)__return_storage_ptr__->NumQueues;
    pUVar47 = pUVar47 + 5;
    lVar33 = lVar33 + 0x18;
  }
  return __return_storage_ptr__;
}

Assistant:

GraphicsAdapterInfo GetPhysicalDeviceGraphicsAdapterInfo(const VulkanUtilities::VulkanPhysicalDevice& PhysicalDevice)
{
    GraphicsAdapterInfo AdapterInfo;

    using ExtensionProperties = VulkanUtilities::VulkanPhysicalDevice::ExtensionProperties;
    using ExtensionFeatures   = VulkanUtilities::VulkanPhysicalDevice::ExtensionFeatures;

    const uint32_t                    vkVersion        = PhysicalDevice.GetVkVersion();
    const VkPhysicalDeviceProperties& vkDeviceProps    = PhysicalDevice.GetProperties();
    const ExtensionProperties&        vkDeviceExtProps = PhysicalDevice.GetExtProperties();
    const VkPhysicalDeviceFeatures&   vkFeatures       = PhysicalDevice.GetFeatures();
    const ExtensionFeatures&          vkExtFeatures    = PhysicalDevice.GetExtFeatures();
    const VkPhysicalDeviceLimits&     vkDeviceLimits   = vkDeviceProps.limits;

    // Set graphics adapter properties
    {
        static_assert(_countof(AdapterInfo.Description) <= _countof(vkDeviceProps.deviceName), "");
        for (size_t i = 0; i < _countof(AdapterInfo.Description) - 1 && vkDeviceProps.deviceName[i] != 0; ++i)
            AdapterInfo.Description[i] = vkDeviceProps.deviceName[i];

        AdapterInfo.Type       = VkPhysicalDeviceTypeToAdapterType(vkDeviceProps.deviceType);
        AdapterInfo.Vendor     = VendorIdToAdapterVendor(vkDeviceProps.vendorID);
        AdapterInfo.VendorId   = vkDeviceProps.vendorID;
        AdapterInfo.DeviceId   = vkDeviceProps.deviceID;
        AdapterInfo.NumOutputs = 0;
    }

    // Label all enabled features as optional
    AdapterInfo.Features = VkFeaturesToDeviceFeatures(vkVersion, vkFeatures, vkDeviceProps, vkExtFeatures, vkDeviceExtProps, DEVICE_FEATURE_STATE_OPTIONAL);

    // Buffer properties
    {
        BufferProperties& BufferProps{AdapterInfo.Buffer};
        BufferProps.ConstantBufferOffsetAlignment   = static_cast<Uint32>(vkDeviceLimits.minUniformBufferOffsetAlignment);
        BufferProps.StructuredBufferOffsetAlignment = static_cast<Uint32>(vkDeviceLimits.minStorageBufferOffsetAlignment);
        ASSERT_SIZEOF(BufferProps, 8, "Did you add a new member to BufferProperites? Please initialize it here.");
    }

    // Texture properties
    {
        TextureProperties& TexProps{AdapterInfo.Texture};
        TexProps.MaxTexture1DDimension      = vkDeviceLimits.maxImageDimension1D;
        TexProps.MaxTexture1DArraySlices    = vkDeviceLimits.maxImageArrayLayers;
        TexProps.MaxTexture2DDimension      = vkDeviceLimits.maxImageDimension2D;
        TexProps.MaxTexture2DArraySlices    = vkDeviceLimits.maxImageArrayLayers;
        TexProps.MaxTexture3DDimension      = vkDeviceLimits.maxImageDimension3D;
        TexProps.MaxTextureCubeDimension    = vkDeviceLimits.maxImageDimensionCube;
        TexProps.Texture2DMSSupported       = True;
        TexProps.Texture2DMSArraySupported  = True;
        TexProps.TextureViewSupported       = True;
        TexProps.CubemapArraysSupported     = vkFeatures.imageCubeArray;
        TexProps.TextureView2DOn3DSupported = vkExtFeatures.HasPortabilitySubset ? vkExtFeatures.PortabilitySubset.imageView2DOn3DImage == VK_TRUE : True;
        ASSERT_SIZEOF(TexProps, 32, "Did you add a new member to TextureProperites? Please initialize it here.");
    }

    // Sampler properties
    {
        SamplerProperties& SamProps{AdapterInfo.Sampler};
        SamProps.BorderSamplingModeSupported = True;
        SamProps.MaxAnisotropy               = static_cast<Uint8>(vkDeviceLimits.maxSamplerAnisotropy);
        SamProps.LODBiasSupported            = True;
        ASSERT_SIZEOF(SamProps, 3, "Did you add a new member to SamplerProperites? Please initialize it here.");
    }

    // Ray tracing properties
    if (AdapterInfo.Features.RayTracing)
    {
        const VkPhysicalDeviceRayTracingPipelinePropertiesKHR&    vkRTPipelineProps = vkDeviceExtProps.RayTracingPipeline;
        const VkPhysicalDeviceAccelerationStructurePropertiesKHR& vkASLimits        = vkDeviceExtProps.AccelStruct;

        RayTracingProperties& RayTracingProps{AdapterInfo.RayTracing};
        RayTracingProps.MaxRecursionDepth        = vkRTPipelineProps.maxRayRecursionDepth;
        RayTracingProps.ShaderGroupHandleSize    = vkRTPipelineProps.shaderGroupHandleSize;
        RayTracingProps.MaxShaderRecordStride    = vkRTPipelineProps.maxShaderGroupStride;
        RayTracingProps.ShaderGroupBaseAlignment = vkRTPipelineProps.shaderGroupBaseAlignment;
        RayTracingProps.MaxRayGenThreads         = vkRTPipelineProps.maxRayDispatchInvocationCount;
        RayTracingProps.MaxInstancesPerTLAS      = static_cast<Uint32>(vkASLimits.maxInstanceCount);
        RayTracingProps.MaxPrimitivesPerBLAS     = static_cast<Uint32>(vkASLimits.maxPrimitiveCount);
        RayTracingProps.MaxGeometriesPerBLAS     = static_cast<Uint32>(vkASLimits.maxGeometryCount);
        RayTracingProps.VertexBufferAlignment    = 1;
        RayTracingProps.IndexBufferAlignment     = 1;
        RayTracingProps.TransformBufferAlignment = 16; // from specs
        RayTracingProps.BoxBufferAlignment       = 8;  // from specs
        RayTracingProps.ScratchBufferAlignment   = static_cast<Uint32>(vkASLimits.minAccelerationStructureScratchOffsetAlignment);
        RayTracingProps.InstanceBufferAlignment  = 16; // from specs

        if (vkExtFeatures.RayTracingPipeline.rayTracingPipeline)
            RayTracingProps.CapFlags |= RAY_TRACING_CAP_FLAG_STANDALONE_SHADERS;
        if (vkExtFeatures.RayQuery.rayQuery)
            RayTracingProps.CapFlags |= RAY_TRACING_CAP_FLAG_INLINE_RAY_TRACING;
        if (vkExtFeatures.RayTracingPipeline.rayTracingPipelineTraceRaysIndirect)
            RayTracingProps.CapFlags |= RAY_TRACING_CAP_FLAG_INDIRECT_RAY_TRACING;
        ASSERT_SIZEOF(RayTracingProps, 60, "Did you add a new member to RayTracingProperites? Please initialize it here.");
    }

    // Wave op properties
    if (AdapterInfo.Features.WaveOp)
    {
        const VkPhysicalDeviceSubgroupProperties& vkWaveProps  = vkDeviceExtProps.Subgroup;
        const VkShaderStageFlags                  WaveOpStages = vkWaveProps.supportedStages;

        VkShaderStageFlags SupportedStages = WaveOpStages & (VK_SHADER_STAGE_VERTEX_BIT | VK_SHADER_STAGE_FRAGMENT_BIT | VK_SHADER_STAGE_COMPUTE_BIT);
        if (vkFeatures.geometryShader != VK_FALSE)
            SupportedStages |= WaveOpStages & VK_SHADER_STAGE_GEOMETRY_BIT;
        if (vkFeatures.tessellationShader != VK_FALSE)
            SupportedStages |= WaveOpStages & (VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT | VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT);
        if (vkExtFeatures.MeshShader.meshShader != VK_FALSE && vkExtFeatures.MeshShader.taskShader != VK_FALSE)
            SupportedStages |= WaveOpStages & (VK_SHADER_STAGE_TASK_BIT_EXT | VK_SHADER_STAGE_MESH_BIT_EXT);
        if (vkExtFeatures.RayTracingPipeline.rayTracingPipeline != VK_FALSE)
        {
            constexpr VkShaderStageFlags VK_SHADER_STAGE_ALL_RAY_TRACING =
                VK_SHADER_STAGE_RAYGEN_BIT_KHR |
                VK_SHADER_STAGE_ANY_HIT_BIT_KHR |
                VK_SHADER_STAGE_CLOSEST_HIT_BIT_KHR |
                VK_SHADER_STAGE_MISS_BIT_KHR |
                VK_SHADER_STAGE_INTERSECTION_BIT_KHR |
                VK_SHADER_STAGE_CALLABLE_BIT_KHR;
            SupportedStages |= WaveOpStages & VK_SHADER_STAGE_ALL_RAY_TRACING;
        }

        WaveOpProperties& WaveOpProps{AdapterInfo.WaveOp};
        WaveOpProps.MinSize         = vkWaveProps.subgroupSize;
        WaveOpProps.MaxSize         = vkWaveProps.subgroupSize;
        WaveOpProps.SupportedStages = VkShaderStageFlagsToShaderTypes(SupportedStages);
        WaveOpProps.Features        = VkSubgroupFeatureFlagsToWaveFeatures(vkWaveProps.supportedOperations);
        ASSERT_SIZEOF(WaveOpProps, 16, "Did you add a new member to WaveOpProperties? Please initialize it here.");
    }

    // Mesh shader properties
    if (AdapterInfo.Features.MeshShaders)
    {
        MeshShaderProperties& MeshProps{AdapterInfo.MeshShader};
        MeshProps.MaxThreadGroupCountX     = vkDeviceExtProps.MeshShader.maxMeshWorkGroupCount[0];
        MeshProps.MaxThreadGroupCountY     = vkDeviceExtProps.MeshShader.maxMeshWorkGroupCount[1];
        MeshProps.MaxThreadGroupCountZ     = vkDeviceExtProps.MeshShader.maxMeshWorkGroupCount[2];
        MeshProps.MaxThreadGroupTotalCount = vkDeviceExtProps.MeshShader.maxMeshWorkGroupTotalCount;
        ASSERT_SIZEOF(MeshProps, 16, "Did you add a new member to MeshShaderProperties? Please initialize it here.");
    }

    // Compute shader properties
    {
        ComputeShaderProperties& CompProps{AdapterInfo.ComputeShader};
        CompProps.SharedMemorySize          = vkDeviceProps.limits.maxComputeSharedMemorySize;
        CompProps.MaxThreadGroupInvocations = vkDeviceProps.limits.maxComputeWorkGroupInvocations;
        CompProps.MaxThreadGroupSizeX       = vkDeviceProps.limits.maxComputeWorkGroupSize[0];
        CompProps.MaxThreadGroupSizeY       = vkDeviceProps.limits.maxComputeWorkGroupSize[1];
        CompProps.MaxThreadGroupSizeZ       = vkDeviceProps.limits.maxComputeWorkGroupSize[2];
        CompProps.MaxThreadGroupCountX      = vkDeviceProps.limits.maxComputeWorkGroupCount[0];
        CompProps.MaxThreadGroupCountY      = vkDeviceProps.limits.maxComputeWorkGroupCount[1];
        CompProps.MaxThreadGroupCountZ      = vkDeviceProps.limits.maxComputeWorkGroupCount[2];
        ASSERT_SIZEOF(CompProps, 32, "Did you add a new member to ComputeShaderProperties? Please initialize it here.");
    }

    // Shading rate properties
    if (AdapterInfo.Features.VariableRateShading)
    {
        ShadingRateProperties& ShadingRateProps{AdapterInfo.ShadingRate};

        // VK_KHR_fragment_shading_rate
        if (vkExtFeatures.ShadingRate.pipelineFragmentShadingRate != VK_FALSE ||
            vkExtFeatures.ShadingRate.primitiveFragmentShadingRate != VK_FALSE ||
            vkExtFeatures.ShadingRate.attachmentFragmentShadingRate != VK_FALSE)
        {
            auto SetShadingRateCap = [&ShadingRateProps](VkBool32 vkFlag, SHADING_RATE_CAP_FLAGS CapFlag) {
                if (vkFlag != VK_FALSE)
                    ShadingRateProps.CapFlags |= CapFlag;
            };

            // clang-format off
            SetShadingRateCap(vkExtFeatures.ShadingRate.pipelineFragmentShadingRate,                          SHADING_RATE_CAP_FLAG_PER_DRAW);
            SetShadingRateCap(vkExtFeatures.ShadingRate.primitiveFragmentShadingRate,                         SHADING_RATE_CAP_FLAG_PER_PRIMITIVE);
            SetShadingRateCap(vkExtFeatures.ShadingRate.attachmentFragmentShadingRate,                        SHADING_RATE_CAP_FLAG_TEXTURE_BASED);
            SetShadingRateCap(vkDeviceExtProps.ShadingRate.fragmentShadingRateWithSampleMask,                 SHADING_RATE_CAP_FLAG_SAMPLE_MASK);
            SetShadingRateCap(vkDeviceExtProps.ShadingRate.fragmentShadingRateWithShaderSampleMask,           SHADING_RATE_CAP_FLAG_SHADER_SAMPLE_MASK);
            SetShadingRateCap(vkDeviceExtProps.ShadingRate.fragmentShadingRateWithShaderDepthStencilWrites,   SHADING_RATE_CAP_FLAG_SHADER_DEPTH_STENCIL_WRITE);
            SetShadingRateCap(vkDeviceExtProps.ShadingRate.primitiveFragmentShadingRateWithMultipleViewports, SHADING_RATE_CAP_FLAG_PER_PRIMITIVE_WITH_MULTIPLE_VIEWPORTS);
            SetShadingRateCap(vkDeviceExtProps.ShadingRate.layeredShadingRateAttachments,                     SHADING_RATE_CAP_FLAG_TEXTURE_ARRAY);
            // clang-format on

            if (ShadingRateProps.CapFlags & SHADING_RATE_CAP_FLAG_TEXTURE_BASED)
                ShadingRateProps.CapFlags |= SHADING_RATE_CAP_FLAG_NON_SUBSAMPLED_RENDER_TARGET;

            // Always enabled in Vulkan
            ShadingRateProps.CapFlags |= SHADING_RATE_CAP_FLAG_SHADING_RATE_SHADER_INPUT;

            ShadingRateProps.Combiners = SHADING_RATE_COMBINER_PASSTHROUGH | SHADING_RATE_COMBINER_OVERRIDE;

            if (vkDeviceExtProps.ShadingRate.fragmentShadingRateNonTrivialCombinerOps != VK_FALSE)
            {
                ShadingRateProps.Combiners |= SHADING_RATE_COMBINER_MIN | SHADING_RATE_COMBINER_MAX;
                ShadingRateProps.Combiners |= (vkDeviceExtProps.ShadingRate.fragmentShadingRateStrictMultiplyCombiner != VK_FALSE) ?
                    SHADING_RATE_COMBINER_MUL :
                    SHADING_RATE_COMBINER_SUM;
            }
            if (vkExtFeatures.ShadingRate.attachmentFragmentShadingRate != VK_FALSE)
            {
                ShadingRateProps.Format         = SHADING_RATE_FORMAT_PALETTE;
                ShadingRateProps.MinTileSize[0] = vkDeviceExtProps.ShadingRate.minFragmentShadingRateAttachmentTexelSize.width;
                ShadingRateProps.MinTileSize[1] = vkDeviceExtProps.ShadingRate.minFragmentShadingRateAttachmentTexelSize.height;
                ShadingRateProps.MaxTileSize[0] = vkDeviceExtProps.ShadingRate.maxFragmentShadingRateAttachmentTexelSize.width;
                ShadingRateProps.MaxTileSize[1] = vkDeviceExtProps.ShadingRate.maxFragmentShadingRateAttachmentTexelSize.height;
            }

            std::vector<VkPhysicalDeviceFragmentShadingRateKHR> ShadingRates;
#if DILIGENT_USE_VOLK
            {
                Uint32 ShadingRateCount = 0;
                vkGetPhysicalDeviceFragmentShadingRatesKHR(PhysicalDevice.GetVkDeviceHandle(), &ShadingRateCount, nullptr);
                VERIFY_EXPR(ShadingRateCount >= 3); // Spec says that implementation must support at least 3 predefined modes.

                ShadingRates.resize(ShadingRateCount);
                for (VkPhysicalDeviceFragmentShadingRateKHR& SR : ShadingRates)
                    SR.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_KHR;
                vkGetPhysicalDeviceFragmentShadingRatesKHR(PhysicalDevice.GetVkDeviceHandle(), &ShadingRateCount, ShadingRates.data());
            }
#else
            UNSUPPORTED("vkGetPhysicalDeviceFragmentShadingRatesKHR is only available through Volk");
#endif
            constexpr VkSampleCountFlags VK_SAMPLE_COUNT_ALL = (VK_SAMPLE_COUNT_64_BIT << 1) - 1;

            ShadingRateProps.NumShadingRates = StaticCast<Uint8>(std::min(ShadingRates.size(), size_t{MAX_SHADING_RATES}));
            for (Uint32 i = 0; i < ShadingRateProps.NumShadingRates; ++i)
            {
                const VkPhysicalDeviceFragmentShadingRateKHR& Src = ShadingRates[i];
                ShadingRateMode&                              Dst = ShadingRateProps.ShadingRates[i];

                // maxFragmentShadingRateRasterizationSamples - contains only maximum bit
                // sampleCounts - contains all supported bits
                VERIFY_EXPR((Src.fragmentSize.width == 1 && Src.fragmentSize.height == 1) ||
                            (Uint32{Src.sampleCounts} <= ((static_cast<Uint32>(vkDeviceExtProps.ShadingRate.maxFragmentShadingRateRasterizationSamples) << 1) - 1)));

                Dst.SampleBits = VkSampleCountFlagsToSampleCount(Src.sampleCounts & VK_SAMPLE_COUNT_ALL);
                Dst.Rate       = VkFragmentSizeToShadingRate(Src.fragmentSize);
            }
        }
        // VK_EXT_fragment_density_map
        else if (vkExtFeatures.FragmentDensityMap.fragmentDensityMap != VK_FALSE)
        {
            ShadingRateProps.Format    = SHADING_RATE_FORMAT_UNORM8;
            ShadingRateProps.Combiners = SHADING_RATE_COMBINER_PASSTHROUGH | SHADING_RATE_COMBINER_OVERRIDE;
            ShadingRateProps.CapFlags =
                SHADING_RATE_CAP_FLAG_TEXTURE_BASED |
                SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS |
                SHADING_RATE_CAP_FLAG_SUBSAMPLED_RENDER_TARGET;

            if (vkExtFeatures.FragmentDensityMap.fragmentDensityMapDynamic != VK_FALSE)
                ShadingRateProps.ShadingRateTextureAccess = SHADING_RATE_TEXTURE_ACCESS_ON_GPU;
            else if (vkExtFeatures.FragmentDensityMap2.fragmentDensityMapDeferred != VK_FALSE)
                ShadingRateProps.ShadingRateTextureAccess = SHADING_RATE_TEXTURE_ACCESS_ON_SUBMIT;
            else
                ShadingRateProps.ShadingRateTextureAccess = SHADING_RATE_TEXTURE_ACCESS_ON_SET_RTV;

            if (vkDeviceExtProps.FragmentDensityMap.fragmentDensityInvocations != VK_FALSE)
                ShadingRateProps.CapFlags |= SHADING_RATE_CAP_FLAG_ADDITIONAL_INVOCATIONS;

            if (vkExtFeatures.FragmentDensityMap.fragmentDensityMapNonSubsampledImages != VK_FALSE)
                ShadingRateProps.CapFlags |= SHADING_RATE_CAP_FLAG_NON_SUBSAMPLED_RENDER_TARGET;

            ShadingRateProps.MaxSabsampledArraySlices = vkDeviceExtProps.FragmentDensityMap2.maxSubsampledArrayLayers; // zero if VK_EXT_fragment_density_map2 is not supported

            ShadingRateProps.MinTileSize[0] = vkDeviceExtProps.FragmentDensityMap.minFragmentDensityTexelSize.width;
            ShadingRateProps.MinTileSize[1] = vkDeviceExtProps.FragmentDensityMap.minFragmentDensityTexelSize.height;
            ShadingRateProps.MaxTileSize[0] = vkDeviceExtProps.FragmentDensityMap.maxFragmentDensityTexelSize.width;
            ShadingRateProps.MaxTileSize[1] = vkDeviceExtProps.FragmentDensityMap.maxFragmentDensityTexelSize.height;

            ShadingRateProps.NumShadingRates            = 1;
            ShadingRateProps.ShadingRates[0].Rate       = SHADING_RATE_1X1;
            ShadingRateProps.ShadingRates[0].SampleBits = SAMPLE_COUNT_ALL;
        }

        // Get supported bind flags
        if (ShadingRateProps.CapFlags & SHADING_RATE_CAP_FLAG_TEXTURE_BASED)
        {
            VkFormat          vkSRTexFormat = VK_FORMAT_UNDEFINED;
            VkImageUsageFlags vkSRTexUsage  = 0;
            if (ShadingRateProps.Format == SHADING_RATE_FORMAT_UNORM8)
            {
                vkSRTexFormat = VK_FORMAT_R8G8_UNORM;
                vkSRTexUsage  = VK_IMAGE_USAGE_FRAGMENT_DENSITY_MAP_BIT_EXT;
            }
            else
            {
                vkSRTexFormat = VK_FORMAT_R8_UINT;
                vkSRTexUsage  = VK_IMAGE_USAGE_FRAGMENT_SHADING_RATE_ATTACHMENT_BIT_KHR;
            }

            auto TestImageUsage = [&](VkImageUsageFlags Usage) {
                VkImageFormatProperties ImgFmtProps{};

                VkResult err = vkGetPhysicalDeviceImageFormatProperties(PhysicalDevice.GetVkDeviceHandle(), vkSRTexFormat, VK_IMAGE_TYPE_2D, VK_IMAGE_TILING_OPTIMAL,
                                                                        vkSRTexUsage | Usage, 0, &ImgFmtProps);
                return err == VK_SUCCESS;
            };

            VkFormatProperties vkFmtProps = {};
            vkGetPhysicalDeviceFormatProperties(PhysicalDevice.GetVkDeviceHandle(), vkSRTexFormat, &vkFmtProps);
            VERIFY_EXPR(vkFmtProps.optimalTilingFeatures & (VK_FORMAT_FEATURE_FRAGMENT_SHADING_RATE_ATTACHMENT_BIT_KHR | VK_FORMAT_FEATURE_FRAGMENT_DENSITY_MAP_BIT_EXT));

            ShadingRateProps.BindFlags = BIND_SHADING_RATE;
            if ((vkFmtProps.optimalTilingFeatures & VK_FORMAT_FEATURE_SAMPLED_IMAGE_BIT) != 0 && TestImageUsage(VK_IMAGE_USAGE_SAMPLED_BIT))
                ShadingRateProps.BindFlags |= BIND_SHADER_RESOURCE;
            if ((vkFmtProps.optimalTilingFeatures & VK_FORMAT_FEATURE_STORAGE_IMAGE_BIT) != 0 && TestImageUsage(VK_IMAGE_USAGE_STORAGE_BIT))
                ShadingRateProps.BindFlags |= BIND_UNORDERED_ACCESS;
            if ((vkFmtProps.optimalTilingFeatures & VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT) != 0 && TestImageUsage(VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT))
                ShadingRateProps.BindFlags |= BIND_RENDER_TARGET;
        }

        ASSERT_SIZEOF(ShadingRateProps, 52, "Did you add a new member to ShadingRateProperties? Please initialize it here.");
    }

    // Draw command properties
    {
        DrawCommandProperties& DrawCommandProps{AdapterInfo.DrawCommand};
        DrawCommandProps.MaxIndexValue        = vkDeviceProps.limits.maxDrawIndexedIndexValue;
        DrawCommandProps.MaxDrawIndirectCount = vkDeviceProps.limits.maxDrawIndirectCount;
        DrawCommandProps.CapFlags             = DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT | DRAW_COMMAND_CAP_FLAG_BASE_VERTEX;
        if (vkFeatures.multiDrawIndirect != VK_FALSE || vkExtFeatures.DrawIndirectCount)
            DrawCommandProps.CapFlags |= DRAW_COMMAND_CAP_FLAG_NATIVE_MULTI_DRAW_INDIRECT;
        if (vkFeatures.drawIndirectFirstInstance != VK_FALSE)
            DrawCommandProps.CapFlags |= DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_FIRST_INSTANCE;
        if (vkExtFeatures.DrawIndirectCount)
            DrawCommandProps.CapFlags |= DRAW_COMMAND_CAP_FLAG_DRAW_INDIRECT_COUNTER_BUFFER;
        ASSERT_SIZEOF(DrawCommandProps, 12, "Did you add a new member to DrawCommandProperties? Please initialize it here.");
    }

    // Sparse memory properties
    if (AdapterInfo.Features.SparseResources)
    {
        // Same check as in VkFeaturesToDeviceFeatures()
        VERIFY_EXPR(vkFeatures.sparseBinding && (vkFeatures.sparseResidencyBuffer || vkFeatures.sparseResidencyImage2D));

        const VkPhysicalDeviceSparseProperties& SparseProps{vkDeviceProps.sparseProperties};
        SparseResourceProperties&               SparseRes{AdapterInfo.SparseResources};
        SparseRes.AddressSpaceSize  = vkDeviceLimits.sparseAddressSpaceSize;
        SparseRes.ResourceSpaceSize = vkDeviceLimits.sparseAddressSpaceSize; // no way to query
        SparseRes.StandardBlockSize = 64u << 10;                             // docs: "All currently defined standard sparse image block shapes are 64 KB in size."

        SparseRes.BufferBindFlags =
            BIND_VERTEX_BUFFER |
            BIND_INDEX_BUFFER |
            BIND_UNIFORM_BUFFER |
            BIND_SHADER_RESOURCE |
            BIND_UNORDERED_ACCESS |
            BIND_INDIRECT_DRAW_ARGS |
            BIND_RAY_TRACING;

        SparseRes.CapFlags |=
            SPARSE_RESOURCE_CAP_FLAG_NON_RESIDENT_SAFE |
            SPARSE_RESOURCE_CAP_FLAG_MIXED_RESOURCE_TYPE_SUPPORT;

        auto SetSparseResCap = [&SparseRes](VkBool32 Feature, SPARSE_RESOURCE_CAP_FLAGS Flag) {
            if (Feature != VK_FALSE)
                SparseRes.CapFlags |= Flag;
        };
        // clang-format off
        SetSparseResCap(SparseProps.residencyStandard2DBlockShape,            SPARSE_RESOURCE_CAP_FLAG_STANDARD_2D_TILE_SHAPE   );
        SetSparseResCap(SparseProps.residencyStandard2DMultisampleBlockShape, SPARSE_RESOURCE_CAP_FLAG_STANDARD_2DMS_TILE_SHAPE );
        SetSparseResCap(SparseProps.residencyStandard3DBlockShape,            SPARSE_RESOURCE_CAP_FLAG_STANDARD_3D_TILE_SHAPE   );
        SetSparseResCap(SparseProps.residencyAlignedMipSize,                  SPARSE_RESOURCE_CAP_FLAG_ALIGNED_MIP_SIZE         );
        SetSparseResCap(SparseProps.residencyNonResidentStrict,               SPARSE_RESOURCE_CAP_FLAG_NON_RESIDENT_STRICT      );
        SetSparseResCap(vkFeatures.shaderResourceResidency,                   SPARSE_RESOURCE_CAP_FLAG_SHADER_RESOURCE_RESIDENCY);
        SetSparseResCap(vkFeatures.sparseResidencyBuffer,                     SPARSE_RESOURCE_CAP_FLAG_BUFFER                   );
        SetSparseResCap(vkFeatures.sparseResidencyImage2D,                    SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D | SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D_ARRAY_MIP_TAIL);
        SetSparseResCap(vkFeatures.sparseResidencyImage3D,                    SPARSE_RESOURCE_CAP_FLAG_TEXTURE_3D               );
        SetSparseResCap(vkFeatures.sparseResidency2Samples,                   SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2_SAMPLES        );
        SetSparseResCap(vkFeatures.sparseResidency4Samples,                   SPARSE_RESOURCE_CAP_FLAG_TEXTURE_4_SAMPLES        );
        SetSparseResCap(vkFeatures.sparseResidency8Samples,                   SPARSE_RESOURCE_CAP_FLAG_TEXTURE_8_SAMPLES        );
        SetSparseResCap(vkFeatures.sparseResidency16Samples,                  SPARSE_RESOURCE_CAP_FLAG_TEXTURE_16_SAMPLES       );
        SetSparseResCap(vkFeatures.sparseResidencyAliased,                    SPARSE_RESOURCE_CAP_FLAG_ALIASED                  );
        // clang-format on

        ASSERT_SIZEOF(SparseRes, 32, "Did you add a new member to SparseResourceProperties? Please initialize it here.");
    }

    // Set memory properties
    {
        AdapterMemoryInfo& Mem{AdapterInfo.Memory};
        Mem.LocalMemory         = 0;
        Mem.HostVisibleMemory   = 0;
        Mem.UnifiedMemory       = 0;
        Mem.MaxMemoryAllocation = vkDeviceExtProps.Maintenance3.maxMemoryAllocationSize;

        std::bitset<VK_MAX_MEMORY_HEAPS> DeviceLocalHeap;
        std::bitset<VK_MAX_MEMORY_HEAPS> HostVisibleHeap;
        std::bitset<VK_MAX_MEMORY_HEAPS> UnifiedHeap;

        const VkPhysicalDeviceMemoryProperties& MemoryProps = PhysicalDevice.GetMemoryProperties();
        for (uint32_t type = 0; type < MemoryProps.memoryTypeCount; ++type)
        {
            const VkMemoryType&             MemTypeInfo        = MemoryProps.memoryTypes[type];
            constexpr VkMemoryPropertyFlags UnifiedMemoryFlags = VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT | VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT;

            if (MemTypeInfo.propertyFlags & VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT)
            {
                Mem.MemorylessTextureBindFlags = BIND_RENDER_TARGET | BIND_DEPTH_STENCIL | BIND_INPUT_ATTACHMENT;
            }
            else if ((MemTypeInfo.propertyFlags & UnifiedMemoryFlags) == UnifiedMemoryFlags)
            {
                UnifiedHeap[MemTypeInfo.heapIndex] = true;
                if (MemTypeInfo.propertyFlags & VK_MEMORY_PROPERTY_HOST_COHERENT_BIT)
                    Mem.UnifiedMemoryCPUAccess |= CPU_ACCESS_WRITE;
                if (MemTypeInfo.propertyFlags & VK_MEMORY_PROPERTY_HOST_CACHED_BIT)
                    Mem.UnifiedMemoryCPUAccess |= CPU_ACCESS_READ;
            }
            else if (MemTypeInfo.propertyFlags & VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT)
            {
                DeviceLocalHeap[MemTypeInfo.heapIndex] = true;
            }
            else if (MemTypeInfo.propertyFlags & VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT)
            {
                HostVisibleHeap[MemTypeInfo.heapIndex] = true;
            }

            // In Metal, input attachment with memoryless texture must be used as an imageblock,
            // which is not supported in SPIRV to MSL translator.
#if PLATFORM_MACOS || PLATFORM_IOS || PLATFORM_TVOS
            if (Mem.MemorylessTextureBindFlags != 0)
                Mem.MemorylessTextureBindFlags = BIND_RENDER_TARGET | BIND_DEPTH_STENCIL;
#endif
        }

        for (uint32_t heap = 0; heap < MemoryProps.memoryHeapCount; ++heap)
        {
            const VkMemoryHeap& HeapInfo = MemoryProps.memoryHeaps[heap];

            if (UnifiedHeap[heap])
                Mem.UnifiedMemory += static_cast<Uint64>(HeapInfo.size);
            else if (DeviceLocalHeap[heap])
                Mem.LocalMemory += static_cast<Uint64>(HeapInfo.size);
            else if (HostVisibleHeap[heap])
                Mem.HostVisibleMemory += static_cast<Uint64>(HeapInfo.size);
        }

        ASSERT_SIZEOF(Mem, 40, "Did you add a new member to AdapterMemoryInfo? Please initialize it here.");
    }

    // Set queue info
    {
        const auto& QueueProperties = PhysicalDevice.GetQueueProperties();
        AdapterInfo.NumQueues       = std::min(MAX_ADAPTER_QUEUES, static_cast<Uint32>(QueueProperties.size()));

        for (Uint32 q = 0; q < AdapterInfo.NumQueues; ++q)
        {
            const VkQueueFamilyProperties& SrcQueue = QueueProperties[q];
            CommandQueueInfo&              DstQueue = AdapterInfo.Queues[q];

            DstQueue.QueueType                 = VkQueueFlagsToCmdQueueType(SrcQueue.queueFlags);
            DstQueue.MaxDeviceContexts         = SrcQueue.queueCount;
            DstQueue.TextureCopyGranularity[0] = SrcQueue.minImageTransferGranularity.width;
            DstQueue.TextureCopyGranularity[1] = SrcQueue.minImageTransferGranularity.height;
            DstQueue.TextureCopyGranularity[2] = SrcQueue.minImageTransferGranularity.depth;
        }
    }

    return AdapterInfo;
}